

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

X * __thiscall IMLE<1,_1,_FastLinearExpert>::predict(IMLE<1,_1,_FastLinearExpert> *this,Z *z)

{
  double *pdVar1;
  pointer *ppMVar2;
  double *pdVar3;
  double dVar4;
  int iVar5;
  pointer pMVar6;
  pointer pdVar7;
  iterator iVar8;
  pointer pFVar9;
  pointer piVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double *pdVar13;
  undefined8 *puVar14;
  Index col;
  long lVar15;
  ulong uVar16;
  plain_array<double,_1,_0,_0> *__x;
  SrcEvaluatorType srcEvaluator;
  long lVar17;
  ulong uVar18;
  Z *pZVar19;
  ActualDstType actualDst;
  iterator __position;
  long lVar20;
  double *pdVar21;
  double *pdVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  double __tmp;
  double dVar28;
  Scal SVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  X sumInvRj;
  X sumInvRxj;
  plain_array<double,_1,_0,_0> local_80;
  plain_array<double,_1,_0,_0> local_78;
  Z *local_70;
  double local_68;
  ArrayX *local_60;
  ArrayX *local_58;
  ArrayScal *local_50;
  long local_48;
  IMLE<1,_1,_FastLinearExpert> *local_40;
  long local_38;
  
  pMVar6 = (this->predictions).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->predictions).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar6) {
    (this->predictions).
    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    .
    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar6;
  }
  pMVar6 = (this->predictionsVar).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->predictionsVar).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar6) {
    (this->predictionsVar).
    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    .
    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar6;
  }
  pdVar7 = (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar7) {
    (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar7;
  }
  if (this->M < 1) {
    dVar28 = 0.0;
  }
  else {
    dVar28 = 0.0;
    lVar25 = 0;
    lVar17 = 0;
    do {
      SVar29 = LinearExpert<1,_1>::queryZ
                         ((LinearExpert<1,_1> *)
                          ((long)&(((this->experts).
                                    super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                                    .
                                    super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_LinearExpert<1,_1>).Nu + lVar25),z);
      dVar28 = dVar28 + SVar29;
      lVar17 = lVar17 + 1;
      lVar25 = lVar25 + 0x1a8;
    } while (lVar17 < this->M);
  }
  if ((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != 1) {
    free((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    pdVar13 = (double *)malloc(8);
    if (pdVar13 == (double *)0x0) goto LAB_00146c4e;
    (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = pdVar13;
  }
  (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       1;
  *(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       dVar28;
  dVar28 = dVar28 + this->pNoiseModelZ;
  if ((this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != 1) {
    free((this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    pdVar13 = (double *)malloc(8);
    if (pdVar13 == (double *)0x0) goto LAB_00146c4e;
    (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar13;
  }
  local_60 = &this->predictions;
  local_58 = &this->predictionsVar;
  local_50 = &this->predictionsWeight;
  (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1;
  *(this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       dVar28;
  this->sumAll = dVar28;
  lVar17 = (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows;
  dVar28 = *(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data;
  iVar5 = this->M;
  lVar25 = (long)iVar5;
  local_70 = z;
  if ((dVar28 != 0.0) || (NAN(dVar28))) {
    if (lVar17 != lVar25) {
      free((this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (iVar5 < 1) {
        pdVar13 = (double *)0x0;
      }
      else {
        pdVar13 = (double *)malloc(lVar25 * 8);
        if (pdVar13 == (double *)0x0) goto LAB_00146c4e;
      }
      (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = pdVar13;
    }
    (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = lVar25;
    lVar17 = (long)this->M;
    if ((lVar17 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar17),0) < 1))
    goto LAB_00146c4e;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->fInvRj,lVar17,1,lVar17);
    lVar17 = (long)this->M;
    if ((lVar17 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar17),0) < 1))
    goto LAB_00146c4e;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->invRxj,lVar17,1,lVar17);
    pZVar19 = local_70;
    if (0 < this->M) {
      local_48 = 0;
      lVar25 = 0;
      lVar20 = 0;
      lVar17 = 0xe0;
      do {
        local_38 = lVar17;
        pFVar9 = (this->experts).
                 super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 .
                 super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        dVar28 = pFVar9[lVar20].super_LinearExpert<1,_1>.gamma *
                 pFVar9[lVar20].super_LinearExpert<1,_1>.p_z_T +
                 *(this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[lVar20] = dVar28;
        pdVar13 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        lVar17 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        if (0 < lVar17) {
          dVar4 = pFVar9[lVar20].super_LinearExpert<1,_1>.p_z_T;
          lVar15 = 0;
          do {
            *(double *)((long)pdVar13 + lVar15 * 8 + lVar17 * lVar25) =
                 (double)pFVar9[lVar20].super_LinearExpert<1,_1>.invPsi.
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage *
                 (dVar4 / dVar28);
            lVar15 = lVar15 + 1;
          } while (lVar17 != lVar15);
        }
        pdVar21 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        uVar16 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        uVar23 = uVar16;
        if ((((ulong)(pdVar21 + uVar16 * lVar20) & 7) == 0) &&
           (uVar23 = (ulong)((uint)((ulong)(pdVar21 + uVar16 * lVar20) >> 3) & 1),
           (long)uVar16 <= (long)uVar23)) {
          uVar23 = uVar16;
        }
        if (0 < (long)uVar23) {
          uVar18 = 0;
          do {
            *(double *)((long)pdVar21 + uVar18 * 8 + uVar16 * lVar25) =
                 pdVar13[lVar17 * lVar20] *
                 *(double *)((long)&(pFVar9->super_LinearExpert<1,_1>).Nu + uVar18 * 8 + local_38);
            uVar18 = uVar18 + 1;
          } while (uVar23 != uVar18);
        }
        lVar24 = uVar16 - uVar23;
        lVar15 = (lVar24 - (lVar24 >> 0x3f) & 0xfffffffffffffffeU) + uVar23;
        if (1 < lVar24) {
          uVar18 = uVar23;
          do {
            pdVar3 = (double *)
                     ((long)&(pFVar9->super_LinearExpert<1,_1>).pred_x + uVar18 * 8 + local_48);
            dVar28 = pdVar3[1];
            pdVar22 = (double *)((long)pdVar13 + uVar18 * 8 + lVar17 * lVar25);
            dVar4 = pdVar22[1];
            pdVar1 = (double *)((long)pdVar21 + uVar18 * 8 + uVar16 * lVar25);
            *pdVar1 = *pdVar22 * *pdVar3;
            pdVar1[1] = dVar4 * dVar28;
            uVar18 = uVar18 + 2;
          } while ((long)uVar18 < lVar15);
        }
        if (lVar15 < (long)uVar16) {
          lVar26 = (lVar24 / 2) * 0x10;
          lVar15 = 0;
          do {
            *(double *)((long)pdVar21 + lVar15 * 8 + uVar16 * lVar25 + lVar26 + uVar23 * 8) =
                 pdVar13[lVar17 * lVar20] *
                 *(double *)
                  ((long)&(pFVar9->super_LinearExpert<1,_1>).Nu +
                  lVar15 * 8 + lVar26 + local_38 + uVar23 * 8);
            lVar15 = lVar15 + 1;
          } while (lVar24 % 2 != lVar15);
        }
        lVar20 = lVar20 + 1;
        lVar25 = lVar25 + 8;
        local_48 = local_48 + 0x1a8;
        lVar17 = local_38 + 0x1a8;
        local_40 = this;
      } while (lVar20 < this->M);
    }
    uVar16 = (ulong)(((uint)&local_78 & 8) >> 3);
    pdVar13 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    lVar17 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    lVar25 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    if (((ulong)&local_78 & 8) == 0) {
      pdVar21 = pdVar13 + lVar17;
      do {
        if (lVar25 == 0) {
          local_78.array[0] = (double  [1])0.0;
        }
        else {
          local_78.array[0] = (double  [1])pdVar13[uVar16];
          pdVar22 = pdVar21;
          lVar20 = lVar25 + -1;
          if (1 < lVar25) {
            do {
              local_78.array[0] = (double  [1])((double)local_78.array[0] + *pdVar22);
              lVar20 = lVar20 + -1;
              pdVar22 = pdVar22 + lVar17;
            } while (lVar20 != 0);
          }
        }
        pdVar21 = pdVar21 + 1;
        bVar27 = uVar16 != 0;
        uVar16 = uVar16 + 1;
      } while (bVar27);
    }
    else {
      pdVar21 = pdVar13 + lVar17;
      uVar23 = 0;
      do {
        if (lVar25 == 0) {
          local_78.array[0] = (double  [1])0.0;
        }
        else {
          local_78.array[0] = (double  [1])pdVar13[uVar23];
          pdVar22 = pdVar21;
          lVar20 = lVar25 + -1;
          if (1 < lVar25) {
            do {
              local_78.array[0] = (double  [1])((double)local_78.array[0] + *pdVar22);
              lVar20 = lVar20 + -1;
              pdVar22 = pdVar22 + lVar17;
            } while (lVar20 != 0);
          }
        }
        uVar23 = uVar23 + 1;
        pdVar21 = pdVar21 + 1;
      } while (uVar23 != uVar16);
    }
    uVar16 = (ulong)(((uint)&local_68 & 8) >> 3);
    pdVar13 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    lVar17 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    lVar25 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    if (((ulong)&local_68 & 8) == 0) {
      pdVar21 = pdVar13 + lVar17;
      do {
        if (lVar25 == 0) {
          local_68 = 0.0;
        }
        else {
          local_68 = pdVar13[uVar16];
          pdVar22 = pdVar21;
          lVar20 = lVar25 + -1;
          if (1 < lVar25) {
            do {
              local_68 = local_68 + *pdVar22;
              lVar20 = lVar20 + -1;
              pdVar22 = pdVar22 + lVar17;
            } while (lVar20 != 0);
          }
        }
        pdVar21 = pdVar21 + 1;
        bVar27 = uVar16 != 0;
        uVar16 = uVar16 + 1;
      } while (bVar27);
    }
    else {
      pdVar21 = pdVar13 + lVar17;
      uVar23 = 0;
      do {
        if (lVar25 == 0) {
          local_68 = 0.0;
        }
        else {
          local_68 = pdVar13[uVar23];
          pdVar22 = pdVar21;
          lVar20 = lVar25 + -1;
          if (1 < lVar25) {
            do {
              local_68 = local_68 + *pdVar22;
              lVar20 = lVar20 + -1;
              pdVar22 = pdVar22 + lVar17;
            } while (lVar20 != 0);
          }
        }
        uVar23 = uVar23 + 1;
        pdVar21 = pdVar21 + 1;
      } while (uVar23 != uVar16);
    }
    local_80.array[0] = (double  [1])(local_68 / (double)local_78.array[0]);
    iVar8._M_current =
         (this->predictions).
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (this->predictions).
        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        .
        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::_M_realloc_insert(&local_60->
                           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                          ,iVar8,(value_type *)&local_80);
    }
    else {
      ((iVar8._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.
      m_data.array[0] = (double)local_80.array[0];
      ppMVar2 = &(this->predictions).
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 .
                 super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar2 = *ppMVar2 + 1;
    }
    local_80.array[0] = (double  [1])(1.0 / (double)local_78.array[0]);
    iVar8._M_current =
         (this->predictionsVar).
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (this->predictionsVar).
        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        .
        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::_M_realloc_insert(&local_58->
                           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                          ,iVar8,(value_type *)&local_80);
    }
    else {
      ((iVar8._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.
      m_data.array[0] = (double)local_80.array[0];
      ppMVar2 = &(this->predictionsVar).
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 .
                 super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar2 = *ppMVar2 + 1;
    }
    local_80.array[0] =
         (double  [1])
         (*(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data / this->sumAll);
    __position._M_current =
         (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __x = &local_80;
      goto LAB_00146bcb;
    }
    *__position._M_current = (double)local_80.array[0];
  }
  else {
    if (lVar17 != lVar25) {
      free((this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (iVar5 < 1) {
        pdVar13 = (double *)0x0;
      }
      else {
        pdVar13 = (double *)malloc(lVar25 * 8);
        if (pdVar13 == (double *)0x0) goto LAB_00146c4e;
      }
      (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = pdVar13;
    }
    (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = lVar25;
    auVar12 = _DAT_001670b0;
    auVar11 = _DAT_001670a0;
    if (0 < iVar5) {
      SVar29 = this->pNoiseModelZ;
      pdVar13 = (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      uVar16 = lVar25 + 0x1fffffffffffffffU & 0x1fffffffffffffff;
      auVar30._8_4_ = (int)uVar16;
      auVar30._0_8_ = uVar16;
      auVar30._12_4_ = (int)(uVar16 >> 0x20);
      lVar17 = 0;
      auVar30 = auVar30 ^ _DAT_001670b0;
      do {
        auVar31._8_4_ = (int)lVar17;
        auVar31._0_8_ = lVar17;
        auVar31._12_4_ = (int)((ulong)lVar17 >> 0x20);
        auVar31 = (auVar31 | auVar11) ^ auVar12;
        if ((bool)(~(auVar31._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar31._0_4_ ||
                    auVar30._4_4_ < auVar31._4_4_) & 1)) {
          pdVar13[lVar17] = SVar29;
        }
        if ((auVar31._12_4_ != auVar30._12_4_ || auVar31._8_4_ <= auVar30._8_4_) &&
            auVar31._12_4_ <= auVar30._12_4_) {
          pdVar13[lVar17 + 1] = SVar29;
        }
        lVar17 = lVar17 + 2;
      } while ((uVar16 - ((uint)(lVar25 + 0x1fffffffffffffffU) & 1)) + 2 != lVar17);
    }
    lVar17 = (long)this->M;
    if ((lVar17 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar17),0) < 1)) {
LAB_00146c4e:
      puVar14 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar14 = operator_delete;
      __cxa_throw(puVar14,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->fInvRj,lVar17,1,lVar17);
    pZVar19 = local_70;
    lVar17 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols *
             (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    if (0 < lVar17) {
      memset((this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data,0,lVar17 * 8);
    }
    lVar17 = (long)this->M;
    if ((lVar17 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar17),0) < 1))
    goto LAB_00146c4e;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->invRxj,lVar17,1,lVar17);
    lVar17 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols *
             (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    if (0 < lVar17) {
      memset((this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data,0,lVar17 * 8);
    }
    iVar8._M_current =
         (this->predictions).
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (this->predictions).
        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        .
        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::_M_realloc_insert(&local_60->
                           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                          ,iVar8,&this->zeroX);
    }
    else {
      ((iVar8._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.
      m_data.array[0] =
           (this->zeroX).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
           m_data.array[0];
      ppMVar2 = &(this->predictions).
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 .
                 super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar2 = *ppMVar2 + 1;
    }
    iVar8._M_current =
         (this->predictionsVar).
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (this->predictionsVar).
        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        .
        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::_M_realloc_insert(&local_58->
                           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                          ,iVar8,&this->infinityX);
    }
    else {
      ((iVar8._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.
      m_data.array[0] =
           (this->infinityX).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
           m_data.array[0];
      ppMVar2 = &(this->predictionsVar).
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 .
                 super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar2 = *ppMVar2 + 1;
    }
    local_78.array[0] = (double  [1])0.0;
    __position._M_current =
         (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __x = &local_78;
LAB_00146bcb:
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                (local_50,__position,__x->array);
      goto LAB_00146bd5;
    }
    *__position._M_current = 0.0;
  }
  (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = __position._M_current + 1;
LAB_00146bd5:
  this->nSolFound = 1;
  piVar10 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar10) {
    (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar10;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->sNearest,(long)this->M,0);
  this->solIdx = 0;
  (this->zQuery).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = (pZVar19->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.m_data.
        array[0];
  this->hasPredJacobian = false;
  this->hasPredErrorReductionDrvt = false;
  return (this->predictions).
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::X const &IMLE_base::predict(Z const &z)
{

    // Clear predict data structure
    predictions.clear();
    predictionsVar.clear();
    predictionsWeight.clear();

#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( z.size() != d )
    {
        message("IMLE::predict: query dimension does not match input dimension!!");

        sum_p_z.setZero(1);
    }
    else
#endif
    {
        Scal sum_p = 0.0;
        for(int j = 0; j < M; j++)
            sum_p += experts[j].queryZ(z);
        sum_p_z.setConstant(1, sum_p);
        sumW.setConstant(1, sum_p + pNoiseModelZ);
        sumAll = sumW(0);
    }

    if(sum_p_z(0) == 0.0)  // This happens when a prediction is sought too far from the current mixture
    {
        varPhiAuxj.setConstant(M,pNoiseModelZ);
        fInvRj.setZero(D,M);
        invRxj.setZero(D,M);

        predictions.push_back(zeroX);
        predictionsVar.push_back(infinityX);
        predictionsWeight.push_back(0.0);
    }
    else
    {
        varPhiAuxj.resize(M);
        fInvRj.resize(D,M);
        invRxj.resize(D,M);
        for(int j = 0; j < M; j++)
        {
            varPhiAuxj(j) = experts[j].getGamma() * experts[j].get_p_z() + sumW(0);
            fInvRj.col(j) = experts[j].getPredXInvVar() * (experts[j].get_p_z() / varPhiAuxj(j));
            invRxj.col(j) = fInvRj.col(j).asDiagonal() * experts[j].getPredX();
        }

        // Update storage results
        X sumInvRj = fInvRj.rowwise().sum();
        X sumInvRxj = invRxj.rowwise().sum();

        predictions.push_back( sumInvRxj.cwiseQuotient(sumInvRj) );
        predictionsVar.push_back( sumInvRj.cwiseInverse() );
        predictionsWeight.push_back( sum_p_z(0) / sumAll );
    }

    nSolFound = 1;
    sNearest.clear();
    sNearest.resize(M,0);

    solIdx = 0;

    zQuery = z;
    hasPredJacobian = false;
    hasPredErrorReductionDrvt = false;

    return predictions[solIdx];
}